

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O1

pair<switches,_int> *
get_switches(pair<switches,_int> *__return_storage_ptr__,int argc,tchar **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  switches result;
  maybe<unsigned_int,_void> local_58;
  switches local_50;
  
  paVar1 = &local_50.db_path.field_2;
  local_50.db_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pstore diff utility\n","");
  bVar2 = pstore::command_line::details::
          parse_command_line_options<char*const*,std::ostream,std::ostream>
                    (argv,argv + argc,&local_50.db_path,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.db_path._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.db_path._M_dataplus._M_p,
                      CONCAT71(local_50.db_path.field_2._M_allocated_capacity._1_7_,
                               local_50.db_path.field_2._M_local_buf[0]) + 1);
    }
    local_50.db_path._M_string_length = 0;
    local_50.db_path.field_2._M_local_buf[0] = '\0';
    local_50.first_revision = 0xffffffff;
    local_50.second_revision.valid_ = false;
    local_50.hex = false;
    local_50.db_path._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_50);
    local_50.first_revision = (anonymous_namespace)::first_revision_abi_cxx11_._136_4_;
    uVar3 = pstore::command_line::option::get_num_occurrences
                      ((option *)(anonymous_namespace)::second_revision_abi_cxx11_);
    if (uVar3 == 0) {
      local_58.valid_ = false;
      local_58._1_3_ = 0;
      local_58.storage_ = (type)0x0;
    }
    else {
      local_58.valid_ = true;
      local_58.storage_ = (type)(anonymous_namespace)::second_revision_abi_cxx11_._136_4_;
    }
    pstore::maybe<unsigned_int,_void>::operator=(&local_50.second_revision,&local_58);
    if (local_58.valid_ == true) {
      local_58 = (maybe<unsigned_int,_void>)((ulong)local_58 & 0xffffffffffffff00);
    }
    local_50.hex = (bool)(anonymous_namespace)::hex[0x88];
    local_58 = (maybe<unsigned_int,_void>)((ulong)local_58 & 0xffffffff00000000);
    std::pair<switches,_int>::pair<switches_&,_int,_true>
              (__return_storage_ptr__,&local_50,(int *)&local_58);
    if (local_50.second_revision.valid_ == true) {
      local_50.second_revision.valid_ = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.db_path._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.db_path._M_dataplus._M_p,
                      CONCAT71(local_50.db_path.field_2._M_allocated_capacity._1_7_,
                               local_50.db_path.field_2._M_local_buf[0]) + 1);
    }
    return __return_storage_ptr__;
  }
  exit(1);
}

Assistant:

std::pair<switches, int> get_switches (int argc, tchar * argv[]) {
    using namespace pstore;
    parse_command_line_options (argc, argv, "pstore diff utility\n");

    switches result;
    result.db_path = db_path.get ();
    result.first_revision = static_cast<unsigned> (first_revision.get ());
    result.second_revision = second_revision.get_num_occurrences () > 0
                                 ? just (static_cast<unsigned> (second_revision.get ()))
                                 : nothing<revision_number> ();
    result.hex = hex.get ();
    return {result, EXIT_SUCCESS};
}